

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_GpuBuffer.H
# Opt level: O2

void __thiscall amrex::Gpu::Buffer<int,_0>::clear(Buffer<int,_0> *this)

{
  free(this->h_data);
  this->d_data = (int *)0x0;
  this->h_data = (int *)0x0;
  return;
}

Assistant:

void clear ()
    {
#ifdef AMREX_USE_GPU
        if (d_data) The_Arena()->free(d_data);
        if (h_data) The_Pinned_Arena()->free(h_data);
#else
        std::free(h_data);
#endif
        d_data = nullptr;
        h_data = nullptr;
    }